

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O3

void __thiscall format::mtx_format_error::~mtx_format_error(mtx_format_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_format_error_00160738;
  pcVar2 = (this->got_format_)._M_dataplus._M_p;
  paVar1 = &(this->got_format_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->expected_format_)._M_dataplus._M_p;
  paVar1 = &(this->expected_format_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_mtx_error = &PTR__mtx_error_001606e8;
  pcVar2 = (this->super_mtx_error).filename_._M_dataplus._M_p;
  paVar1 = &(this->super_mtx_error).filename_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::runtime_error::~runtime_error((runtime_error *)this);
  operator_delete(this,0x70);
  return;
}

Assistant:

mtx_format_error
  (
    std::string expected_format,
    std::string got_format,
    std::string filename = "Unknown",
    std::string msg = "Matrix format mismatch"
  )
  : mtx_error(filename, msg)
  {
   expected_format_ = expected_format;
   got_format_ = got_format;
  }